

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

exr_result_t unpack_16bit_4chan(exr_decode_pipeline_t *decode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  exr_coding_channel_info_t *peVar11;
  uint8_t *puVar12;
  void *pvVar13;
  ulong uVar14;
  uint8_t *puVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  void *pvVar20;
  void *pvVar21;
  uint8_t *puVar22;
  void *pvVar23;
  uint8_t *local_70;
  uint8_t *local_68;
  
  iVar1 = (decode->chunk).height;
  if (0 < iVar1) {
    peVar11 = decode->channels;
    pvVar13 = decode->unpacked_buffer;
    uVar2 = peVar11->width;
    uVar14 = (ulong)uVar2;
    iVar3 = peVar11[3].user_pixel_stride;
    iVar4 = peVar11[2].user_pixel_stride;
    iVar5 = peVar11[1].user_pixel_stride;
    iVar6 = peVar11->user_pixel_stride;
    local_70 = peVar11[3].field_12.decode_to_ptr;
    local_68 = peVar11[2].field_12.decode_to_ptr;
    puVar15 = peVar11[1].field_12.decode_to_ptr;
    puVar12 = (peVar11->field_12).decode_to_ptr;
    iVar7 = peVar11[3].user_line_stride;
    iVar8 = peVar11[2].user_line_stride;
    iVar9 = peVar11[1].user_line_stride;
    iVar10 = peVar11->user_line_stride;
    lVar17 = (long)(int)uVar2;
    lVar19 = (long)(int)(uVar2 * 8);
    pvVar23 = (void *)((long)pvVar13 + lVar17 * 2);
    pvVar20 = (void *)((long)pvVar13 + lVar17 * 4);
    pvVar21 = (void *)((long)pvVar13 + lVar17 * 6);
    iVar16 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar18 = 0;
        puVar22 = puVar12;
        do {
          *(undefined2 *)puVar22 = *(undefined2 *)((long)pvVar13 + uVar18 * 2);
          uVar18 = uVar18 + 1;
          puVar22 = puVar22 + iVar6;
        } while (uVar14 != uVar18);
        if (0 < (int)uVar2) {
          uVar18 = 0;
          puVar22 = puVar15;
          do {
            *(undefined2 *)puVar22 = *(undefined2 *)((long)pvVar23 + uVar18 * 2);
            uVar18 = uVar18 + 1;
            puVar22 = puVar22 + iVar5;
          } while (uVar14 != uVar18);
          if (0 < (int)uVar2) {
            uVar18 = 0;
            puVar22 = local_68;
            do {
              *(undefined2 *)puVar22 = *(undefined2 *)((long)pvVar20 + uVar18 * 2);
              uVar18 = uVar18 + 1;
              puVar22 = puVar22 + iVar4;
            } while (uVar14 != uVar18);
            if (0 < (int)uVar2) {
              uVar18 = 0;
              puVar22 = local_70;
              do {
                *(undefined2 *)puVar22 = *(undefined2 *)((long)pvVar21 + uVar18 * 2);
                uVar18 = uVar18 + 1;
                puVar22 = puVar22 + iVar3;
              } while (uVar14 != uVar18);
            }
          }
        }
      }
      pvVar13 = (void *)((long)pvVar13 + lVar19);
      puVar12 = puVar12 + iVar10;
      puVar15 = puVar15 + iVar9;
      local_68 = local_68 + iVar8;
      local_70 = local_70 + iVar7;
      iVar16 = iVar16 + 1;
      pvVar23 = (void *)((long)pvVar23 + lVar19);
      pvVar20 = (void *)((long)pvVar20 + lVar19);
      pvVar21 = (void *)((long)pvVar21 + lVar19);
    } while (iVar16 != iVar1);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_4chan (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t *       out0, *out1, *out2, *out3;
    int             w, h;
    int             inc0, inc1, inc2, inc3;
    int             linc0, linc1, linc2, linc3;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    inc0  = decode->channels[0].user_pixel_stride;
    inc1  = decode->channels[1].user_pixel_stride;
    inc2  = decode->channels[2].user_pixel_stride;
    inc3  = decode->channels[3].user_pixel_stride;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;
    linc3 = decode->channels[3].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;
    out3 = decode->channels[3].decode_to_ptr;

    for (int y = 0; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        in3 = in2 + w;
        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out0 + x * inc0)) = one_to_native16 (in0[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out1 + x * inc1)) = one_to_native16 (in1[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out2 + x * inc2)) = one_to_native16 (in2[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out3 + x * inc3)) = one_to_native16 (in3[x]);
        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
        out3 += linc3;
    }
    return EXR_ERR_SUCCESS;
}